

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O1

void __thiscall iDynTree::Traversal::~Traversal(Traversal *this)

{
  pointer piVar1;
  pointer ppIVar2;
  pointer ppLVar3;
  
  reset(this,0);
  piVar1 = (this->linkIndexToTraversalIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->linkIndexToTraversalIndex).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  ppIVar2 = (this->toParentJoints).
            super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppIVar2 != (pointer)0x0) {
    operator_delete(ppIVar2,(long)(this->toParentJoints).
                                  super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar2
                   );
  }
  ppLVar3 = (this->parents).
            super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar3 != (pointer)0x0) {
    operator_delete(ppLVar3,(long)(this->parents).
                                  super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar3
                   );
  }
  ppLVar3 = (this->links).
            super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar3 != (pointer)0x0) {
    operator_delete(ppLVar3,(long)(this->links).
                                  super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar3
                   );
    return;
  }
  return;
}

Assistant:

Traversal::~Traversal()
{
    reset(0);
}